

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * GetFunctionUpvalue(ExpressionContext *ctx,SynBase *source,VariableData *target)

{
  uint alignment;
  uint uniqueId;
  Allocator *allocator;
  ScopeData *scope;
  int iVar1;
  uint offset;
  int iVar2;
  VariableData **ppVVar3;
  undefined4 extraout_var;
  TypeRef *type;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  VariableData *variable_00;
  TypeBase *type_00;
  InplaceStr upvalueName;
  VariableData *variable;
  ExprVariableAccess *this;
  
  upvalueName = GetFunctionVariableUpvalueName(ctx,target);
  ppVVar3 = SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::find
                      (&ctx->upvalueMap,&upvalueName);
  if (ppVVar3 == (VariableData **)0x0) {
    type = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    offset = anon_unknown.dwarf_ff84f::AllocateGlobalVariable
                       (ctx,source,(type->super_TypeBase).alignment,(type->super_TypeBase).size);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    allocator = ctx->allocator;
    scope = ctx->globalScope;
    alignment = (type->super_TypeBase).alignment;
    iVar2 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_01,iVar2),upvalueName);
    uniqueId = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData
              ((VariableData *)CONCAT44(extraout_var_00,iVar1),allocator,source,scope,alignment,
               &type->super_TypeBase,(SynIdentifier *)CONCAT44(extraout_var_01,iVar2),offset,
               uniqueId);
    variable = (VariableData *)CONCAT44(extraout_var_00,iVar1);
    SmallArray<VariableData_*,_4U>::push_back(&ctx->globalScope->variables,&variable);
    SmallArray<VariableData_*,_4U>::push_back(&ctx->globalScope->allVariables,&variable);
    SmallArray<VariableData_*,_128U>::push_back(&ctx->variables,&variable);
    SmallArray<VariableData_*,_128U>::push_back(&ctx->upvalues,&variable);
    SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
              (&ctx->upvalueMap,&upvalueName,&variable);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    this = (ExprVariableAccess *)CONCAT44(extraout_var_02,iVar1);
    type_00 = variable->type;
    variable_00 = variable;
  }
  else {
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    this = (ExprVariableAccess *)CONCAT44(extraout_var,iVar1);
    type_00 = (*ppVVar3)->type;
    variable_00 = *ppVVar3;
  }
  ExprVariableAccess::ExprVariableAccess(this,source,type_00,variable_00);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* GetFunctionUpvalue(ExpressionContext &ctx, SynBase *source, VariableData *target)
{
	InplaceStr upvalueName = GetFunctionVariableUpvalueName(ctx, target);

	if(VariableData **variable = ctx.upvalueMap.find(upvalueName))
	{
		return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, (*variable)->type, *variable);
	}

	TypeBase *type = ctx.GetReferenceType(ctx.typeVoid);

	unsigned offset = AllocateGlobalVariable(ctx, source, type->alignment, type->size);
	VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.globalScope, type->alignment, type, new (ctx.get<SynIdentifier>()) SynIdentifier(upvalueName), offset, ctx.uniqueVariableId++);

	ctx.globalScope->variables.push_back(variable);
	ctx.globalScope->allVariables.push_back(variable);

	ctx.variables.push_back(variable);

	ctx.upvalues.push_back(variable);
	ctx.upvalueMap.insert(upvalueName, variable);

	return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, variable->type, variable);
}